

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::UpdatePhiNodes
          (MergeReturnPass *this,BasicBlock *new_source,BasicBlock *target)

{
  anon_class_16_2_afed9415 local_50;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  BasicBlock *local_20;
  BasicBlock *target_local;
  BasicBlock *new_source_local;
  MergeReturnPass *this_local;
  
  local_50.this = this;
  local_50.new_source = new_source;
  local_20 = target;
  target_local = new_source;
  new_source_local = (BasicBlock *)this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::MergeReturnPass::UpdatePhiNodes(spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_40,&local_50);
  BasicBlock::ForEachPhiInst(target,&local_40,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

void MergeReturnPass::UpdatePhiNodes(BasicBlock* new_source,
                                     BasicBlock* target) {
  target->ForEachPhiInst([this, new_source](Instruction* inst) {
    uint32_t undefId = Type2Undef(inst->type_id());
    inst->AddOperand({SPV_OPERAND_TYPE_ID, {undefId}});
    inst->AddOperand({SPV_OPERAND_TYPE_ID, {new_source->id()}});
    context()->UpdateDefUse(inst);
  });
}